

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O3

chunk_conflict * mtn_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  int A;
  loc grid;
  short sVar1;
  char *pcVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  int y;
  int x;
  wchar_t wVar7;
  chunk *c;
  ulong uVar8;
  feature *pfVar9;
  ulong uVar10;
  loc_conflict lVar11;
  loc_conflict lVar12;
  loc_conflict grid2;
  int iVar13;
  long lVar14;
  uint uVar15;
  int A_00;
  long lVar16;
  wchar_t wVar17;
  ulong uVar18;
  long lVar19;
  long local_1b8;
  int local_17c;
  wchar_t form_feats [7];
  loc_conflict stairs [3];
  loc_conflict pathpoints [20];
  wchar_t randpoints [20];
  
  wVar17 = (wchar_t)p->place;
  sVar1 = p->last_place;
  form_feats[0] = FEAT_PASS_RUBBLE;
  form_feats[1] = FEAT_RUBBLE;
  form_feats[2] = FEAT_GRASS;
  form_feats[3] = FEAT_TREE;
  form_feats[4] = FEAT_TREE2;
  form_feats[5] = FEAT_ROAD;
  form_feats[6] = FEAT_NONE;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar17;
  wVar6 = c->height;
  if (L'\0' < wVar6) {
    uVar8 = (ulong)(uint)c->width;
    lVar14 = 0;
    lVar16 = 0;
    do {
      if (0 < (int)uVar8) {
        lVar19 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar14 + lVar19),FEAT_GRASS);
          lVar19 = lVar19 + 1;
          uVar8 = (ulong)c->width;
        } while (lVar19 < (long)uVar8);
        wVar6 = c->height;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x100000000;
    } while (lVar16 < wVar6);
  }
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,false,false);
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar17,(int)sVar1,wVar6);
  wVar6 = c->height;
  if (L'\0' < wVar6) {
    uVar8 = (ulong)(uint)c->width;
    lVar16 = 0;
    lVar14 = 0;
    do {
      if (0 < (int)uVar8) {
        lVar19 = 0;
        do {
          pfVar9 = square_feat((chunk_conflict *)c,(loc)(lVar19 + lVar16));
          if (pfVar9->fidx == FEAT_GRASS) {
            square_set_feat((chunk_conflict *)c,(loc)(lVar19 + lVar16),FEAT_GRANITE);
          }
          lVar19 = lVar19 + 1;
          uVar8 = (ulong)c->width;
        } while (lVar19 < (long)uVar8);
        wVar6 = c->height;
      }
      lVar14 = lVar14 + 1;
      lVar16 = lVar16 + 0x100000000;
    } while (lVar14 < wVar6);
  }
  pcVar2 = world->levels[wVar17].down;
  if (pcVar2 != (char *)0x0) {
    iVar13 = 3;
LAB_0015c3a9:
    do {
      uVar4 = Rand_div(c->height + L'\xfffffffe');
      uVar5 = Rand_div(c->width + L'\xfffffffe');
      grid.y = uVar4 + L'\x01';
      grid.x = uVar5 + L'\x01';
      pfVar9 = square_feat((chunk_conflict *)c,grid);
      if (pfVar9->fidx != FEAT_ROAD) {
        pfVar9 = square_feat((chunk_conflict *)c,grid);
        if (pfVar9->fidx != FEAT_GRASS) goto LAB_0015c3a9;
      }
      square_set_feat((chunk_conflict *)c,grid,FEAT_MORE);
      square_mark((chunk_conflict *)c,grid);
      stairs[3 - iVar13].x = uVar5 + L'\x01';
      stairs[3 - iVar13].y = uVar4 + L'\x01';
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    wVar6 = level_topography((int)sVar1);
    if (wVar6 == L'\a') {
      player_place((chunk_conflict2 *)c,p,(loc_conflict)grid);
    }
    wVar6 = c->height;
  }
  if (wVar6 < L'\x01') {
    wVar17 = L'\0';
  }
  else {
    uVar8 = (ulong)(uint)c->width;
    local_1b8 = 0;
    lVar14 = 0;
    wVar17 = L'\0';
    do {
      if (0 < (int)uVar8) {
        lVar16 = 0;
        do {
          pfVar9 = square_feat((chunk_conflict *)c,(loc)(local_1b8 + lVar16));
          if (pfVar9->fidx == FEAT_ROAD) {
            square_mark((chunk_conflict *)c,(loc)(local_1b8 + lVar16));
            wVar17 = wVar17 + L'\x01';
          }
          lVar16 = lVar16 + 1;
          uVar8 = (ulong)c->width;
        } while (lVar16 < (long)uVar8);
        wVar6 = c->height;
      }
      lVar14 = lVar14 + 1;
      local_1b8 = local_1b8 + 0x100000000;
    } while (lVar14 < wVar6);
  }
  uVar15 = height / 2;
  uVar8 = (ulong)(uint)(width / 2);
  lVar14 = 0;
  do {
    wVar6 = Rand_div(wVar17);
    randpoints[lVar14] = wVar6;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x14);
  wVar6 = c->height;
  if (L'\0' < wVar6) {
    uVar10 = (ulong)(uint)c->width;
    lVar14 = 0;
    do {
      if (0 < (int)uVar10) {
        uVar18 = 0;
        do {
          pfVar9 = square_feat((chunk_conflict *)c,(loc)(lVar14 << 0x20 | uVar18));
          if (pfVar9->fidx == FEAT_ROAD) {
            wVar17 = wVar17 + L'\xffffffff';
            lVar16 = 0;
            do {
              if (wVar17 == randpoints[lVar16]) {
                pathpoints[lVar16].x = (int)uVar18;
                pathpoints[lVar16].y = (int)lVar14;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x14);
          }
          uVar18 = uVar18 + 1;
          uVar10 = (ulong)c->width;
        } while ((long)uVar18 < (long)uVar10);
        wVar6 = c->height;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < wVar6);
  }
  if (pcVar2 != (char *)0x0) {
    lVar14 = 0;
    do {
      wVar6 = c->height + c->width;
      lVar11 = stairs[lVar14];
      lVar16 = 0;
      do {
        lVar12 = pathpoints[lVar16];
        wVar17 = distance(lVar11,lVar12);
        if (wVar17 < wVar6) {
          uVar15 = lVar12.x;
        }
        if (wVar17 < wVar6) {
          wVar6 = wVar17;
          uVar8 = (ulong)lVar12 >> 0x20;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x14);
      mtn_connect((chunk_conflict *)c,lVar11,(loc_conflict)((ulong)uVar15 | uVar8 << 0x20));
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
  }
  local_17c = rand_range(2,4);
  iVar13 = 0;
  do {
    uVar4 = Rand_div(6);
    A = uVar4 + 4;
    uVar5 = Rand_div(5);
    A_00 = uVar5 + 4;
    y = rand_range(A_00,(c->height - uVar5) + -5);
    x = rand_range(A,(c->width - uVar4) + -5);
    lVar11 = loc(x,y);
    lVar12 = loc(-4 - uVar4,-4 - uVar5);
    lVar11 = loc_sum(lVar11,lVar12);
    lVar12 = loc(x,y);
    grid2 = loc(A,A_00);
    lVar12 = loc_sum(lVar12,grid2);
    _Var3 = check_clearing_space((chunk_conflict *)c,lVar11,lVar12);
    if ((_Var3) &&
       (_Var3 = generate_starburst_room(c,y - A_00,x - A,A_00 + y,A + x,false,FEAT_GRASS,true),
       _Var3)) {
      lVar11 = loc(x,y);
      wVar6 = c->height + c->width;
      lVar14 = 0;
      do {
        lVar12 = pathpoints[lVar14];
        wVar17 = distance(lVar11,lVar12);
        if (wVar17 < wVar6) {
          uVar15 = lVar12.x;
        }
        if (wVar17 < wVar6) {
          wVar6 = wVar17;
          uVar8 = (ulong)lVar12 >> 0x20;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x14);
      mtn_connect((chunk_conflict *)c,lVar11,(loc_conflict)((ulong)uVar15 | uVar8 << 0x20));
      local_17c = local_17c + -1;
      if (local_17c == 0) break;
    }
    iVar13 = iVar13 + 1;
  } while (iVar13 != 0x32);
  if (L'\0' < c->depth) {
    iVar13 = 0;
    do {
      uVar4 = Rand_div(c->height + L'\xfffffffe');
      uVar5 = Rand_div(c->width + L'\xfffffffe');
      lVar11.x = uVar5 + 1;
      lVar11.y = uVar4 + 1;
      wVar17 = make_formation((chunk_conflict *)c,p,lVar11,FEAT_GRANITE,FEAT_GRANITE,form_feats,
                              "Mountain",c->depth * 2);
      wVar6 = c->height + c->width;
      lVar14 = 0;
      do {
        lVar12 = pathpoints[lVar14];
        wVar7 = distance(lVar11,lVar12);
        if (wVar7 < wVar6) {
          uVar15 = lVar12.x;
        }
        if (wVar7 < wVar6) {
          wVar6 = wVar7;
          uVar8 = (ulong)lVar12 >> 0x20;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x14);
      iVar13 = iVar13 + wVar17;
      mtn_connect((chunk_conflict *)c,lVar11,(loc_conflict)((ulong)uVar15 | uVar8 << 0x20));
    } while (SBORROW4(iVar13,c->depth * 0x32) != iVar13 + c->depth * -0x32 < 0);
  }
  wVar6 = c->height;
  if (L'\0' < wVar6) {
    uVar8 = (ulong)(uint)c->width;
    lVar14 = 0;
    lVar16 = 0;
    do {
      if (0 < (int)uVar8) {
        lVar19 = 0;
        do {
          square_unmark((chunk_conflict *)c,(loc)(lVar14 + lVar19));
          lVar19 = lVar19 + 1;
          uVar8 = (ulong)c->width;
        } while (lVar19 < (long)uVar8);
        wVar6 = c->height;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x100000000;
    } while (lVar16 < wVar6);
  }
  ensure_connectedness(c,false);
  populate((chunk_conflict *)c,false);
  _Var3 = verify_level((chunk_conflict *)c);
  if (!_Var3) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *mtn_gen(struct player *p, int height, int width,
					  const char **p_error)
{
	struct loc grid;
	int i, j;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int min, dist, floors = 0;
	int randpoints[20];
	struct loc pathpoints[20];
	struct loc nearest_point = { height / 2, width / 2 };
	struct loc stairs[3];

	int form_feats[] = { FEAT_PASS_RUBBLE, FEAT_RUBBLE, FEAT_GRASS,
						 FEAT_TREE, FEAT_TREE2, FEAT_ROAD, FEAT_NONE };

	bool amon_rudh = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass (lets paths work -NRM-) */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Place 2 or 3 paths to neighbouring places, make the paths through the
	 * place, place the player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Turn grass to granite */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				square_set_feat(c, grid, FEAT_GRANITE);
			}
		}
	}

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* Set the flag */
		amon_rudh = true;

		/* Mim's cave on Amon Rudh */
		i = 3;
		while (i) {
			grid.y = randint0(c->height - 2) + 1;
			grid.x = randint0(c->width - 2) + 1;
			if ((square_feat(c, grid)->fidx == FEAT_ROAD) ||
				(square_feat(c, grid)->fidx == FEAT_GRASS)) {
				square_set_feat(c, grid, FEAT_MORE);
				square_mark(c, grid);
				i--;
				stairs[2 - i] = grid;
				if (!i && (level_topography(last_place) == TOP_CAVE))
					player_place(c, p, grid);
			}
		}
	}


	/* Make paths permanent */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				/* Hack - prepare for plateaux, connecting */
				square_mark(c, grid);
				floors++;
			}
		}
	}

	/* Pick some joining points */
	for (j = 0; j < 20; j++)
		randpoints[j] = randint0(floors);
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD)
				floors--;
			else
				continue;
			for (j = 0; j < 20; j++) {
				if (floors == randpoints[j]) {
					pathpoints[j] = grid;
				}
			}
		}
	}

	/* Find the staircases, if any */
	if (amon_rudh) {
		for (j = 0; j < 3; j++) {
			grid = stairs[j];

			/* Now join them up */
			min = c->width + c->height;
			for (i = 0; i < 20; i++) {
				dist = distance(grid, pathpoints[i]);
				if (dist < min) {
					min = dist;
					nearest_point = pathpoints[i];
				}
			}
			mtn_connect(c, grid, nearest_point);
		}
	}

	/* Make a few "plateaux" */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, y;

		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		y = rand_range(b, c->height - 1 - b);
		x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(loc(x, y), loc(-a, -b)),
				loc_sum(loc(x, y), loc(a, b)))
				|| !generate_starburst_room(c, y - b, x - a,
				y + b, x + a, false, FEAT_GRASS, true)) continue;

		/* Success */
		grid = loc(x, y);
		plats--;

		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

		/* Done ? */
		if (!plats)
			break;
	}

	/* Make a few formations */
	while (form_grids < 50 * (c->depth)) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_GRANITE, FEAT_GRANITE,
									 form_feats, "Mountain", c->depth * 2);
		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}
	ensure_connectedness(c, false);

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}